

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trait.cpp
# Opt level: O1

void MeshLib::Trait::updateUV(string *traitString,Point *p)

{
  size_t sVar1;
  string attval;
  string attname;
  char str [256];
  string local_168;
  string local_148;
  char local_128 [264];
  
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"uv","");
  sprintf(local_128,"%g %g",p->v[0],p->v[1]);
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  sVar1 = strlen(local_128);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,local_128,local_128 + sVar1);
  updateTraitString(traitString,&local_148,&local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Trait::updateUV(std::string &traitString, Point p)
{
	std::string attname("uv");
	char str[256];
	sprintf(str, "%g %g", p[0], p[1]);
	std::string attval( str );
	Trait::updateTraitString ( traitString, attname, attval );
}